

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

void av1_get_max_min_partition_features
               (AV1_COMP *cpi,MACROBLOCK *x,int mi_row,int mi_col,float *features)

{
  byte bVar1;
  byte bVar2;
  int16_t iVar3;
  int iVar4;
  int_mv iVar5;
  long in_RSI;
  long in_RDI;
  float *in_R8;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float var_log_sse;
  float avg_log_sse;
  float var_mv_col;
  float avg_mv_col;
  float var_mv_row;
  float avg_mv_row;
  int blks;
  float abs_mv_col;
  float abs_mv_row;
  float log_sse;
  float mv_col;
  float mv_row;
  int_mv best_mv;
  MV_REFERENCE_FRAME ref;
  FULLPEL_MV start_mv;
  uint var;
  uint sse;
  int this_mi_col;
  int this_mi_row;
  int mb_col;
  int mb_row;
  int mb_in_mi_size_wide_log2;
  int mb_in_mi_size_high_log2;
  int mb_cols;
  int mb_rows;
  BLOCK_SIZE mb_size;
  float max_log_sse;
  float min_log_sse;
  float sum_log_sse;
  float sum_log_sse_sq;
  float max_abs_mv_col;
  float min_abs_mv_col;
  float sum_mv_col;
  float sum_mv_col_sq;
  float max_abs_mv_row;
  float min_abs_mv_row;
  float sum_mv_row;
  float sum_mv_row_sq;
  float log_q_sq;
  int dc_q;
  int f_idx;
  BLOCK_SIZE sb_size;
  MACROBLOCKD *xd;
  AV1_COMMON *cm;
  int in_stack_00000178;
  BLOCK_SIZE in_stack_0000017f;
  int in_stack_00000180;
  int in_stack_00000184;
  MACROBLOCK *in_stack_00000188;
  AV1_COMP *in_stack_00000190;
  FULLPEL_MV in_stack_000001b0;
  int in_stack_000001b8;
  int in_stack_000001c0;
  uint *in_stack_000001c8;
  uint *in_stack_000001d0;
  aom_bit_depth_t in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  int in_stack_ffffffffffffff00;
  short local_a8;
  short sStack_a6;
  int local_8c;
  int local_88;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  
  bVar1 = *(byte *)(*(long *)(in_RDI + 0x42008) + 0x1c);
  iVar3 = av1_dc_quant_QTX(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                           in_stack_fffffffffffffef8);
  iVar4 = (int)iVar3 >> ((char)*(undefined4 *)(in_RSI + 0x2b40) - 8U & 0x1f);
  fVar6 = log1pf((float)(iVar4 * iVar4) / 256.0);
  local_44 = 0.0;
  local_48 = 0.0;
  local_4c = 3.4028235e+38;
  local_50 = 0.0;
  local_54 = 0.0;
  local_58 = 0.0;
  local_5c = 3.4028235e+38;
  local_60 = 0.0;
  local_64 = 0.0;
  local_68 = 0.0;
  local_6c = 3.4028235e+38;
  local_70 = 0.0;
  bVar2 = block_size_high[bVar1];
  bVar1 = block_size_wide[bVar1];
  for (local_88 = 0; local_88 < (int)(bVar2 / 0x10); local_88 = local_88 + 1) {
    for (local_8c = 0; local_8c < (int)(bVar1 / 0x10); local_8c = local_8c + 1) {
      iVar5 = av1_simple_motion_search_sse_var
                        (in_stack_00000190,in_stack_00000188,in_stack_00000184,in_stack_00000180,
                         in_stack_0000017f,in_stack_00000178,in_stack_000001b0,in_stack_000001b8,
                         in_stack_000001c0,in_stack_000001c8,in_stack_000001d0);
      local_a8 = iVar5.as_mv.row;
      iVar4 = (int)local_a8;
      if (local_a8 < 0) {
        iVar4 = local_a8 + 7;
      }
      fVar7 = (float)(iVar4 >> 3);
      sStack_a6 = iVar5.as_mv.col;
      iVar4 = (int)sStack_a6;
      if ((int)iVar5.as_int < 0) {
        iVar4 = sStack_a6 + 7;
      }
      fVar8 = (float)(iVar4 >> 3);
      fVar9 = log1pf(0.0);
      fVar10 = ABS(fVar7);
      fVar11 = ABS(fVar8);
      local_44 = fVar7 * fVar7 + local_44;
      local_48 = fVar7 + local_48;
      local_54 = fVar8 * fVar8 + local_54;
      local_58 = fVar8 + local_58;
      if (fVar10 < local_4c) {
        local_4c = fVar10;
      }
      if (local_50 < fVar10) {
        local_50 = fVar10;
      }
      if (fVar11 < local_5c) {
        local_5c = fVar11;
      }
      if (local_60 < fVar11) {
        local_60 = fVar11;
      }
      local_64 = fVar9 * fVar9 + local_64;
      local_68 = fVar9 + local_68;
      if (fVar9 < local_6c) {
        local_6c = fVar9;
      }
      if (local_70 < fVar9) {
        local_70 = fVar9;
      }
    }
  }
  iVar4 = (bVar2 / 0x10) * (bVar1 / 0x10);
  local_48 = local_48 / (float)iVar4;
  local_58 = local_58 / (float)iVar4;
  local_68 = local_68 / (float)iVar4;
  *in_R8 = local_68;
  in_R8[1] = local_58;
  in_R8[2] = local_48;
  in_R8[3] = fVar6;
  in_R8[4] = local_60;
  in_R8[5] = local_50;
  in_R8[6] = local_70;
  in_R8[7] = local_5c;
  in_R8[8] = local_4c;
  in_R8[9] = local_6c;
  in_R8[10] = -local_68 * local_68 + local_64 / (float)iVar4;
  in_R8[0xb] = -local_58 * local_58 + local_54 / (float)iVar4;
  in_R8[0xc] = -local_48 * local_48 + local_44 / (float)iVar4;
  return;
}

Assistant:

void av1_get_max_min_partition_features(AV1_COMP *const cpi, MACROBLOCK *x,
                                        int mi_row, int mi_col,
                                        float *features) {
  AV1_COMMON *const cm = &cpi->common;
  MACROBLOCKD *xd = &x->e_mbd;
  const BLOCK_SIZE sb_size = cm->seq_params->sb_size;

  // Currently this only allows 128X128 SB size. May extend it to 64X64 SB size.
  assert(sb_size == BLOCK_128X128);

  int f_idx = 0;

  const int dc_q = av1_dc_quant_QTX(x->qindex, 0, xd->bd) >> (xd->bd - 8);
  const float log_q_sq = log1pf((float)(dc_q * dc_q) / 256.0f);

  // Perform full-pixel single motion search in Y plane of 16x16 mbs in the sb
  float sum_mv_row_sq = 0;
  float sum_mv_row = 0;
  float min_abs_mv_row = FLT_MAX;
  float max_abs_mv_row = 0;

  float sum_mv_col_sq = 0;
  float sum_mv_col = 0;
  float min_abs_mv_col = FLT_MAX;
  float max_abs_mv_col = 0;

  float sum_log_sse_sq = 0;
  float sum_log_sse = 0;
  float min_log_sse = FLT_MAX;
  float max_log_sse = 0;

  const BLOCK_SIZE mb_size = BLOCK_16X16;
  const int mb_rows = block_size_high[sb_size] / block_size_high[mb_size];
  const int mb_cols = block_size_wide[sb_size] / block_size_wide[mb_size];
  const int mb_in_mi_size_high_log2 = mi_size_high_log2[mb_size];
  const int mb_in_mi_size_wide_log2 = mi_size_wide_log2[mb_size];

  for (int mb_row = 0; mb_row < mb_rows; mb_row++)
    for (int mb_col = 0; mb_col < mb_cols; mb_col++) {
      const int this_mi_row = mi_row + (mb_row << mb_in_mi_size_high_log2);
      const int this_mi_col = mi_col + (mb_col << mb_in_mi_size_wide_log2);
      unsigned int sse = 0;
      unsigned int var = 0;
      const FULLPEL_MV start_mv = kZeroFullMv;
      const MV_REFERENCE_FRAME ref =
          cpi->rc.is_src_frame_alt_ref ? ALTREF_FRAME : LAST_FRAME;
      const int_mv best_mv = av1_simple_motion_search_sse_var(
          cpi, x, this_mi_row, this_mi_col, mb_size, ref, start_mv, 1, 0, &sse,
          &var);

      const float mv_row = (float)(best_mv.as_mv.row / 8);
      const float mv_col = (float)(best_mv.as_mv.col / 8);
      const float log_sse = log1pf((float)sse);
      const float abs_mv_row = fabsf(mv_row);
      const float abs_mv_col = fabsf(mv_col);

      sum_mv_row_sq += mv_row * mv_row;
      sum_mv_row += mv_row;
      sum_mv_col_sq += mv_col * mv_col;
      sum_mv_col += mv_col;

      if (abs_mv_row < min_abs_mv_row) min_abs_mv_row = abs_mv_row;
      if (abs_mv_row > max_abs_mv_row) max_abs_mv_row = abs_mv_row;
      if (abs_mv_col < min_abs_mv_col) min_abs_mv_col = abs_mv_col;
      if (abs_mv_col > max_abs_mv_col) max_abs_mv_col = abs_mv_col;

      sum_log_sse_sq += log_sse * log_sse;
      sum_log_sse += log_sse;
      if (log_sse < min_log_sse) min_log_sse = log_sse;
      if (log_sse > max_log_sse) max_log_sse = log_sse;
    }
  const int blks = mb_rows * mb_cols;
  const float avg_mv_row = sum_mv_row / (float)blks;
  const float var_mv_row =
      sum_mv_row_sq / (float)blks - avg_mv_row * avg_mv_row;

  const float avg_mv_col = sum_mv_col / (float)blks;
  const float var_mv_col =
      sum_mv_col_sq / (float)blks - avg_mv_col * avg_mv_col;

  const float avg_log_sse = sum_log_sse / (float)blks;
  const float var_log_sse =
      sum_log_sse_sq / (float)blks - avg_log_sse * avg_log_sse;

  features[f_idx++] = avg_log_sse;
  features[f_idx++] = avg_mv_col;
  features[f_idx++] = avg_mv_row;
  features[f_idx++] = log_q_sq;
  features[f_idx++] = max_abs_mv_col;
  features[f_idx++] = max_abs_mv_row;
  features[f_idx++] = max_log_sse;
  features[f_idx++] = min_abs_mv_col;
  features[f_idx++] = min_abs_mv_row;
  features[f_idx++] = min_log_sse;
  features[f_idx++] = var_log_sse;
  features[f_idx++] = var_mv_col;
  features[f_idx++] = var_mv_row;

  assert(f_idx == FEATURE_SIZE_MAX_MIN_PART_PRED);
}